

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void boost::unordered::detail::foa::
     table_arrays<slang::parsing::KnownSystemName,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<slang::parsing::KnownSystemName>_>
     ::set_arrays(size_t *param_1,allocator<slang::parsing::KnownSystemName> *param_2)

{
  size_t groups_size_00;
  pointer pKVar1;
  value_type *pvVar2;
  pointer pgVar3;
  group_type *pgVar4;
  uchar *p;
  allocator_type sal;
  size_t groups_size;
  size_t groups_size_index;
  allocator<slang::parsing::KnownSystemName> *in_stack_ffffffffffffffa8;
  
  groups_size_00 = pow2_size_policy::size(*param_1);
  std::allocator<slang::parsing::KnownSystemName>::allocator(param_2,in_stack_ffffffffffffffa8);
  buffer_size(groups_size_00);
  pKVar1 = std::allocator_traits<std::allocator<slang::parsing::KnownSystemName>_>::allocate
                     (param_2,(size_type)in_stack_ffffffffffffffa8);
  param_1[3] = (size_t)pKVar1;
  pvVar2 = elements((table_arrays<slang::parsing::KnownSystemName,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<slang::parsing::KnownSystemName>_>
                     *)0x4b1010);
  pgVar3 = std::
           pointer_traits<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*>
           ::pointer_to((__make_not_void<element_type>_conflict5 *)
                        ((0x10U - (long)(pvVar2 + groups_size_00 * 0xf + -1) & 0xf) +
                        (long)(pvVar2 + groups_size_00 * 0xf + -1)));
  param_1[2] = (size_t)pgVar3;
  pgVar4 = groups((table_arrays<slang::parsing::KnownSystemName,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<slang::parsing::KnownSystemName>_>
                   *)0x4b1061);
  initialize_groups(pgVar4,groups_size_00);
  groups((table_arrays<slang::parsing::KnownSystemName,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<slang::parsing::KnownSystemName>_>
          *)0x4b1078);
  group15<boost::unordered::detail::foa::plain_integral>::set_sentinel
            ((group15<boost::unordered::detail::foa::plain_integral> *)0x4b1090);
  return;
}

Assistant:

static void set_arrays(table_arrays& arrays, allocator_type al, std::size_t,
                           std::false_type /* always allocate */) {
        using storage_traits = std::allocator_traits<allocator_type>;
        auto groups_size_index = arrays.groups_size_index;
        auto groups_size = size_policy::size(groups_size_index);

        auto sal = allocator_type(al);
        arrays.elements_ = storage_traits::allocate(sal, buffer_size(groups_size));

        /* Align arrays.groups to sizeof(group_type). table_iterator critically
         * depends on such alignment for its increment operation.
         */

        auto p = reinterpret_cast<unsigned char*>(arrays.elements() + groups_size * N - 1);
        p += (uintptr_t(sizeof(group_type)) - reinterpret_cast<uintptr_t>(p)) % sizeof(group_type);
        arrays.groups_ = group_type_pointer_traits::pointer_to(*reinterpret_cast<group_type*>(p));

        initialize_groups(arrays.groups(), groups_size,
                          is_trivially_default_constructible<group_type>{});
        arrays.groups()[groups_size - 1].set_sentinel();
    }